

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this)

{
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_00000018;
  TPZManVector<TPZCompElSide,_5> *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  TPZMultiphysicsElement *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>>(in_RDI,0x21)
  ;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02501df0);
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (in_stack_ffffffffffffffe0,
             (void **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined ***)in_RDI = &PTR__TPZMultiphysicsCompEl_02501ab8;
  *(undefined ***)in_RDI = &PTR__TPZMultiphysicsCompEl_02501ab8;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(in_stack_00000020,in_stack_00000018);
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0xe8));
  TPZIntTriang::TPZIntTriang((TPZIntTriang *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl() : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(), fElementVec(0){
}